

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmTarget * __thiscall
cmMakefile::AddNewUtilityTarget(cmMakefile *this,string *utilityName,bool excludeFromAll)

{
  cmTarget *this_00;
  allocator<char> local_49;
  string local_48;
  cmTarget *local_28;
  cmTarget *target;
  string *psStack_18;
  bool excludeFromAll_local;
  string *utilityName_local;
  cmMakefile *this_local;
  
  target._7_1_ = excludeFromAll;
  psStack_18 = utilityName;
  utilityName_local = (string *)this;
  this_00 = AddNewTarget(this,UTILITY,utilityName);
  local_28 = this_00;
  if ((target._7_1_ & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"EXCLUDE_FROM_ALL",&local_49);
    cmTarget::SetProperty(this_00,&local_48,"TRUE");
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  return local_28;
}

Assistant:

cmTarget* cmMakefile::AddNewUtilityTarget(const std::string& utilityName,
                                          bool excludeFromAll)
{
  cmTarget* target = this->AddNewTarget(cmStateEnums::UTILITY, utilityName);
  if (excludeFromAll) {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }
  return target;
}